

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

double __thiscall DynamicHistogram<double>::frequency(DynamicHistogram<double> *this,int index)

{
  pointer pdVar1;
  int iVar2;
  runtime_error *this_00;
  
  iVar2 = (*this->_vptr_DynamicHistogram[2])();
  if ((char)iVar2 == '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"DynamicHistogram::frequency - Histogram could not be initialized.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pdVar1 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(long)index <
      (ulong)((long)(this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_finish - (long)pdVar1 >> 3)) {
    return pdVar1[index];
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

double
    frequency(int const index)
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::frequency - Histogram could not be initialized.");
        return this->frequency_(index);
    }